

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.c
# Opt level: O1

uint64_t hashmap_sip(void *data,size_t len,uint64_t seed0,uint64_t seed1)

{
  ulong uVar1;
  uint64_t k1;
  ulong *puVar2;
  uint64_t k0;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar3 = seed1 ^ 0x7465646279746573;
  uVar4 = seed0 ^ 0x6c7967656e657261;
  uVar5 = seed1 ^ 0x646f72616e646f6d;
  uVar1 = seed0 ^ 0x736f6d6570736575;
  puVar2 = (ulong *)((long)data + (len - ((uint)len & 7)));
  if (puVar2 != (ulong *)data) {
    do {
      uVar1 = uVar1 + uVar5;
      uVar6 = (uVar5 << 0xd | uVar5 >> 0x33) ^ uVar1;
      uVar3 = uVar3 ^ *data;
      uVar5 = (uVar3 << 0x10 | uVar3 >> 0x30) ^ uVar4 + uVar3;
      uVar1 = (uVar1 << 0x20 | uVar1 >> 0x20) + uVar5;
      uVar4 = uVar4 + uVar3 + uVar6;
      uVar6 = (uVar6 << 0x11 | uVar6 >> 0x2f) ^ uVar4;
      uVar3 = (uVar5 << 0x15 | uVar5 >> 0x2b) ^ uVar1;
      uVar1 = uVar1 + uVar6;
      uVar5 = (uVar6 << 0xd | uVar6 >> 0x33) ^ uVar1;
      uVar4 = (uVar4 << 0x20 | uVar4 >> 0x20) + uVar3;
      uVar3 = (uVar3 << 0x10 | uVar3 >> 0x30) ^ uVar4;
      uVar1 = (uVar1 << 0x20 | uVar1 >> 0x20) + uVar3;
      uVar4 = uVar4 + uVar5;
      uVar5 = (uVar5 << 0x11 | uVar5 >> 0x2f) ^ uVar4;
      uVar4 = uVar4 << 0x20 | uVar4 >> 0x20;
      uVar3 = (uVar3 << 0x15 | uVar3 >> 0x2b) ^ uVar1;
      uVar1 = uVar1 ^ *data;
      data = (void *)((long)data + 8);
    } while ((ulong *)data != puVar2);
  }
  uVar6 = len << 0x38;
  switch((uint)len & 7) {
  case 7:
    uVar6 = uVar6 | (ulong)*(byte *)((long)data + 6) << 0x30;
  case 6:
    uVar6 = uVar6 | (ulong)*(byte *)((long)data + 5) << 0x28;
  case 5:
    uVar6 = uVar6 | (ulong)*(byte *)((long)data + 4) << 0x20;
  case 4:
    uVar6 = uVar6 | (ulong)*(byte *)((long)data + 3) << 0x18;
  case 3:
    uVar6 = uVar6 | (ulong)*(byte *)((long)data + 2) << 0x10;
  case 2:
    uVar6 = uVar6 | (ulong)*(byte *)((long)data + 1) << 8;
  case 1:
    uVar6 = uVar6 | (byte)*data;
  case 0:
    uVar1 = uVar1 + uVar5;
    uVar7 = (uVar5 << 0xd | uVar5 >> 0x33) ^ uVar1;
    uVar3 = uVar3 ^ uVar6;
    uVar5 = (uVar3 << 0x10 | uVar3 >> 0x30) ^ uVar4 + uVar3;
    uVar1 = (uVar1 << 0x20 | uVar1 >> 0x20) + uVar5;
    uVar4 = uVar4 + uVar3 + uVar7;
    uVar7 = (uVar7 << 0x11 | uVar7 >> 0x2f) ^ uVar4;
    uVar3 = (uVar5 << 0x15 | uVar5 >> 0x2b) ^ uVar1;
    uVar1 = uVar1 + uVar7;
    uVar5 = (uVar7 << 0xd | uVar7 >> 0x33) ^ uVar1;
    uVar4 = (uVar4 << 0x20 | uVar4 >> 0x20) + uVar3;
    uVar3 = (uVar3 << 0x10 | uVar3 >> 0x30) ^ uVar4;
    uVar1 = (uVar1 << 0x20 | uVar1 >> 0x20) + uVar3;
    uVar4 = uVar4 + uVar5;
    uVar3 = (uVar3 << 0x15 | uVar3 >> 0x2b) ^ uVar1;
    uVar5 = (uVar5 << 0x11 | uVar5 >> 0x2f) ^ uVar4;
    uVar1 = (uVar1 ^ uVar6) + uVar5;
    uVar5 = (uVar5 << 0xd | uVar5 >> 0x33) ^ uVar1;
    uVar4 = ((uVar4 << 0x20 | uVar4 >> 0x20) ^ 0xff) + uVar3;
    uVar3 = (uVar3 << 0x10 | uVar3 >> 0x30) ^ uVar4;
    uVar1 = (uVar1 << 0x20 | uVar1 >> 0x20) + uVar3;
    uVar4 = uVar4 + uVar5;
    uVar5 = (uVar5 << 0x11 | uVar5 >> 0x2f) ^ uVar4;
    uVar3 = (uVar3 << 0x15 | uVar3 >> 0x2b) ^ uVar1;
    uVar1 = uVar1 + uVar5;
    uVar5 = (uVar5 << 0xd | uVar5 >> 0x33) ^ uVar1;
    uVar4 = (uVar4 << 0x20 | uVar4 >> 0x20) + uVar3;
    uVar3 = (uVar3 << 0x10 | uVar3 >> 0x30) ^ uVar4;
    uVar1 = (uVar1 << 0x20 | uVar1 >> 0x20) + uVar3;
    uVar4 = uVar4 + uVar5;
    uVar5 = (uVar5 << 0x11 | uVar5 >> 0x2f) ^ uVar4;
    uVar3 = (uVar3 << 0x15 | uVar3 >> 0x2b) ^ uVar1;
    uVar1 = uVar1 + uVar5;
    uVar5 = (uVar5 << 0xd | uVar5 >> 0x33) ^ uVar1;
    uVar4 = (uVar4 << 0x20 | uVar4 >> 0x20) + uVar3;
    uVar3 = (uVar3 << 0x10 | uVar3 >> 0x30) ^ uVar4;
    uVar1 = (uVar1 << 0x20 | uVar1 >> 0x20) + uVar3;
    uVar4 = uVar4 + uVar5;
    uVar5 = (uVar5 << 0x11 | uVar5 >> 0x2f) ^ uVar4;
    uVar3 = (uVar3 << 0x15 | uVar3 >> 0x2b) ^ uVar1;
    uVar4 = (uVar4 << 0x20 | uVar4 >> 0x20) + uVar3;
    uVar3 = (uVar3 << 0x10 | uVar3 >> 0x30) ^ uVar4;
    uVar1 = (uVar5 << 0xd | uVar5 >> 0x33) ^ uVar1 + uVar5;
    uVar4 = uVar4 + uVar1;
    return (uVar4 << 0x20 | uVar4 >> 0x20) ^ uVar4 ^
           (uVar1 << 0x11 | uVar1 >> 0x2f) ^ (uVar3 << 0x15 | uVar3 >> 0x2b);
  }
}

Assistant:

uint64_t hashmap_sip(const void *data, size_t len, uint64_t seed0,
    uint64_t seed1)
{
    return SIP64((uint8_t*)data, len, seed0, seed1);
}